

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O2

vector<double,_std::allocator<double>_> * __thiscall
ChebTools::ChebyshevExpansion::real_roots_UH
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,ChebyshevExpansion *this,
          bool only_in_domain)

{
  Scalar *pSVar1;
  Index i;
  long index;
  ArrayXd real_eigs;
  void *local_78 [2];
  double x;
  MatrixXd local_50;
  MatrixXd *local_38;
  
  companion_matrix(&local_50,this,&this->m_c);
  local_38 = &local_50;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&x,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)&local_38);
  eigenvalues_upperHessenberg((ChebTools *)local_78,(MatrixXd *)&x,true);
  Eigen::PlainObjectBase<Eigen::Array<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((PlainObjectBase<Eigen::Array<double,_1,1,0,_1,1>> *)&real_eigs,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_78);
  free(local_78[0]);
  free((void *)x);
  free(local_50.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (index = 0;
      index < real_eigs.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows; index = index + 1) {
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_1> *)&real_eigs,
                        index);
    if ((!only_in_domain) || (ABS(*pSVar1) <= 1.0)) {
      x = ((this->m_xmax - this->m_xmin) * *pSVar1 + this->m_xmax + this->m_xmin) * 0.5;
      std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&x);
    }
  }
  free(real_eigs.super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> ChebyshevExpansion::real_roots_UH(bool only_in_domain) const {
        // The companion matrix is definitely lower Hessenberg, so we can skip the Hessenberg
        // decomposition, and get the real eigenvalues directly.  These eigenvalues are defined
        // in the domain [-1, 1], but it might also include values outside [-1, 1]
        Eigen::ArrayXd real_eigs = eigenvalues_upperHessenberg(companion_matrix(coef()).transpose(), /* balance = */ true);
        
        
        
        std::vector<double> roots;
        for (Eigen::Index i = 0; i < real_eigs.size(); ++i){
            double val_n11 = real_eigs(i);
            const bool is_in_domain = (val_n11 >= -1.0 && val_n11 <= 1.0);
            // Keep it if it is in domain, or if you just want all real roots
            if (!only_in_domain || is_in_domain){
                // Rescale back into real-world values in [xmin,xmax] from [-1,1]
                double x = ((m_xmax - m_xmin)*val_n11 + (m_xmax + m_xmin)) / 2.0;
                roots.push_back(x);
            }
        }
        return roots;
    }